

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

int SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = -0x385;
  if (((NLS != (SUNNonlinearSolver)0x0) && (plVar1 = (long *)NLS->content, *plVar1 != 0)) &&
     (plVar1[1] != 0)) {
    plVar1[0x13] = 0;
    plVar1[0x14] = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL) return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* reset the total number of iterations and convergence failures */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  return(SUN_NLS_SUCCESS);
}